

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<int>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_int *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  long *plVar1;
  undefined8 uVar2;
  undefined1 uVar3;
  int iVar4;
  uint32_t uVar5;
  ostream *poVar6;
  undefined8 *puVar7;
  optional<tinyusdz::Interpolation> *poVar8;
  const_iterator cVar9;
  long *plVar10;
  mapped_type *pmVar11;
  _Base_ptr p_Var12;
  optional<tinyusdz::Interpolation> oVar13;
  undefined8 uVar14;
  anon_struct_8_0_00000001_for___align aVar15;
  storage_t<double> __n;
  size_t __n_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  char *__src;
  bool bVar16;
  bool bVar17;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e_1;
  optional<tinyusdz::Animatable<int>_> av;
  optional<tinyusdz::Interpolation> in_stack_fffffffffffff9f8;
  optional<tinyusdz::Interpolation> local_600;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f8;
  undefined1 local_5e8 [8];
  undefined1 local_5e0 [8];
  undefined1 local_5d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_5c8;
  undefined1 local_5b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a8 [2];
  undefined8 local_588;
  undefined1 local_580 [56];
  undefined1 local_548 [8];
  undefined1 local_540 [48];
  undefined1 local_510 [32];
  undefined1 local_4f0 [56];
  undefined1 local_4b8 [24];
  undefined1 local_4a0 [24];
  undefined1 local_488 [12];
  storage_t<unsigned_int> sStack_47c;
  undefined1 local_478 [16];
  storage_t<tinyusdz::value::StringData> local_468;
  ios_base local_418 [264];
  undefined1 local_310 [32];
  key_type local_2f0;
  string local_2d0;
  undefined1 local_2b0 [12];
  storage_t<unsigned_int> sStack_2a4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  storage_t<tinyusdz::value::StringData> sStack_290;
  bool local_260;
  undefined1 local_258 [24];
  undefined1 auStack_240 [48];
  undefined1 local_210 [40];
  storage_t<tinyusdz::Token> local_1e8;
  bool local_1c8;
  storage_t<tinyusdz::Token> local_1c0;
  bool local_1a0;
  undefined1 local_198 [56];
  undefined1 local_160 [40];
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  bool local_118;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  size_t local_c8;
  storage_t<tinyusdz::Token> sStack_c0;
  undefined1 local_a0 [24];
  bool bStack_88;
  undefined1 local_80 [80];
  
  local_540._24_8_ = (long)local_540 + 8;
  local_540._8_4_ = 0;
  local_540._16_8_ = (_Link_type)0x0;
  local_540._40_8_ = 0;
  local_5e8 = (undefined1  [8])err;
  local_5a8[1]._8_8_ = preader;
  local_580._40_8_ = warn;
  local_540._32_8_ = local_540._24_8_;
  local_2b0._0_8_ = &local_2a0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"info:id","");
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)local_540,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._0_8_ != &local_2a0) {
    operator_delete((void *)local_2b0._0_8_,local_2a0._M_allocated_capacity + 1);
  }
  p_Var12 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_4b8._8_8_ = &(properties->_M_t)._M_impl.super__Rb_tree_header;
  if (p_Var12 != (_Base_ptr)local_4b8._8_8_) {
    local_588 = local_5a8[1]._8_8_ + 0x730;
    local_4b8._0_8_ = local_5a8[1]._8_8_ + 0x940;
    local_4f0._40_8_ = local_5a8[1]._8_8_ + 0x958;
    local_580._48_8_ = local_5a8[1]._8_8_ + 0x990;
    local_580._32_8_ = local_5a8[1]._8_8_ + 0xc10;
    local_4f0._32_8_ = local_5a8[1]._8_8_ + 0xe20;
    local_4f0._48_8_ = local_5a8[1]._8_8_ + 0x6d0;
    do {
      local_510._0_8_ = (long)local_510 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_510,*(long *)(p_Var12 + 1),
                 (long)&(p_Var12[1]._M_parent)->_M_color + *(long *)(p_Var12 + 1));
      local_5b8._0_8_ = local_5a8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"inputs:fallback","");
      uVar2 = local_510._8_8_;
      uVar14 = local_5b8._8_8_;
      local_5d8._0_8_ = &aStack_5c8;
      local_5d8._8_8_ = (char *)0x0;
      aStack_5c8._M_allocated_capacity = aStack_5c8._M_allocated_capacity & 0xffffffffffffff00;
      aVar15 = (anon_struct_8_0_00000001_for___align)local_510._8_8_;
      if ((ulong)local_5b8._8_8_ < (ulong)local_510._8_8_) {
        aVar15 = (anon_struct_8_0_00000001_for___align)local_5b8._8_8_;
      }
      if (aVar15 == (anon_struct_8_0_00000001_for___align)0x0) {
        bVar16 = true;
      }
      else {
        iVar4 = bcmp((void *)local_510._0_8_,(void *)local_5b8._0_8_,(size_t)aVar15);
        bVar16 = iVar4 == 0;
      }
      local_5a8[1]._0_8_ = p_Var12 + 2;
      if ((bool)(bVar16 ^ 1U | uVar2 != uVar14)) {
        local_5e0._0_4_ = 1;
      }
      else {
        if (((ulong)p_Var12[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
          local_5e0._0_4_ = 7;
          in_stack_fffffffffffff9f8.has_value_ = true;
          in_stack_fffffffffffff9f8._1_3_ = 0;
          in_stack_fffffffffffff9f8.contained = (storage_t<tinyusdz::Interpolation>)0x0;
          local_488._0_8_ = (optional<tinyusdz::Interpolation> *)local_478;
          local_488._0_8_ =
               ::std::__cxx11::string::_M_create((ulong *)local_488,(ulong)&stack0xfffffffffffff9f8)
          ;
          *(undefined8 *)local_488._0_8_ = 0x79747265706f7250;
          *(undefined8 *)(local_488._0_8_ + 8) = 0x756d20607d7b6020;
          *(undefined8 *)(local_488._0_8_ + 0x10) = 0x7441206562207473;
          *(undefined8 *)(local_488._0_8_ + 0x18) = 0x2c65747562697274;
          *(undefined8 *)(local_488._0_8_ + 0x20) = 0x6365642074756220;
          *(undefined8 *)(local_488._0_8_ + 0x28) = 0x736120646572616c;
          builtin_strncpy((char *)((long)&((optional<tinyusdz::Interpolation> *)
                                          (local_488._0_8_ + 0x28))->contained + 2),"as Relat",8);
          builtin_strncpy((char *)((long)&((optional<tinyusdz::Interpolation> *)
                                          (local_488._0_8_ + 0x30))->contained + 2),"ionship.",8);
          (&((optional<tinyusdz::Interpolation> *)local_488._0_8_)->has_value_)
          [(long)in_stack_fffffffffffff9f8] = false;
          unique0x10002dd9 = in_stack_fffffffffffff9f8;
          local_478._0_8_ = in_stack_fffffffffffff9f8;
          fmt::format<std::__cxx11::string>
                    ((string *)local_2b0,(fmt *)local_488,(string *)local_5b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9f8);
          ::std::__cxx11::string::operator=((string *)local_5d8,(string *)local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._0_8_ != &local_2a0) {
            operator_delete((void *)local_2b0._0_8_,local_2a0._M_allocated_capacity + 1);
          }
          if ((optional<tinyusdz::Interpolation> *)local_488._0_8_ !=
              (optional<tinyusdz::Interpolation> *)local_478) {
            operator_delete((void *)local_488._0_8_,local_478._0_8_ + 1);
          }
        }
        if (p_Var12[6]._M_left != p_Var12[6]._M_parent) {
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_4b8._0_8_,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var12[6]._M_parent);
          local_5e0 = (undefined1  [8])((ulong)local_5e0 & 0xffffffff00000000);
        }
        Attribute::type_name_abi_cxx11_
                  ((string *)&stack0xfffffffffffff9f8,(Attribute *)local_5a8[1]._0_8_);
        local_2b0._0_8_ = &local_2a0;
        local_2b0[8] = true;
        local_2b0._9_3_ = 0;
        sStack_2a4 = (storage_t<unsigned_int>)0x0;
        local_2a0._M_allocated_capacity._0_4_ = 0x746e69;
        if (local_600 == (optional<tinyusdz::Interpolation>)0x3) {
          bVar16 = *(char *)((long)in_stack_fffffffffffff9f8 + 2) == 't' &&
                   *(short *)in_stack_fffffffffffff9f8 == 0x6e69;
        }
        else {
          bVar16 = false;
        }
        bVar17 = true;
        if (!bVar16) {
          local_4f0._0_8_ = (long)local_4f0 + 0x10;
          local_4f0[0x12] = 0x74;
          local_4f0._16_2_ = 0x6e69;
          local_4f0._8_8_ = 3;
          local_4f0[0x13] = 0;
          if (local_600 == (optional<tinyusdz::Interpolation>)0x3) {
            bVar17 = *(char *)((long)in_stack_fffffffffffff9f8 + 2) == 't' &&
                     *(short *)in_stack_fffffffffffff9f8 == 0x6e69;
          }
          else {
            bVar17 = false;
          }
        }
        if ((!bVar16) && (local_4f0._0_8_ != (long)local_4f0 + 0x10)) {
          operator_delete((void *)local_4f0._0_8_,
                          CONCAT44(local_4f0._20_4_,
                                   CONCAT13(local_4f0[0x13],
                                            CONCAT12(local_4f0[0x12],local_4f0._16_2_))) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._0_8_ != &local_2a0) {
          operator_delete((void *)local_2b0._0_8_,local_2a0._M_allocated_capacity + 1);
        }
        if (bVar17) {
          iVar4 = *(int *)((long)&p_Var12[0x17]._M_parent + 4);
          if (iVar4 != 1) {
            if (iVar4 == 0) {
              *(bool *)(local_5a8[1]._8_8_ + 0x938) = true;
              AttrMetas::operator=((AttrMetas *)local_588,(AttrMetas *)(p_Var12 + 7));
              __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b8;
LAB_002481ca:
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_540,__v);
              local_5e0 = (undefined1  [8])((ulong)local_5e0 & 0xffffffff00000000);
            }
            else {
              warn = (string *)0x25;
              ::std::__cxx11::string::_M_replace
                        ((ulong)local_5d8,0,(char *)local_5d8._8_8_,0x42de0e);
              local_5e0._0_4_ = 8;
            }
            goto LAB_002481d7;
          }
          if (p_Var12[5]._M_left == p_Var12[5]._M_parent) {
            if (p_Var12[4]._M_right == (_Base_ptr)0x0) {
              bVar16 = false;
            }
            else {
              iVar4 = (**(code **)p_Var12[4]._M_right)();
              bVar16 = iVar4 == 4;
            }
            if ((bVar16) || ((p_Var12[5]._M_color & _S_black) != _S_red)) {
              *(bool *)(local_5a8[1]._8_8_ + 0x988) = true;
            }
          }
          if (((char)p_Var12[5]._M_color == _S_red) &&
             ((((p_Var12[4]._M_right != (_Base_ptr)0x0 &&
                (iVar4 = (**(code **)p_Var12[4]._M_right)(), iVar4 == 0)) ||
               ((p_Var12[4]._M_right != (_Base_ptr)0x0 &&
                (iVar4 = (**(code **)p_Var12[4]._M_right)(), iVar4 == 1)))) &&
              (p_Var12[5]._M_left == p_Var12[5]._M_parent)))) {
            bVar16 = true;
            bVar17 = false;
          }
          else {
            anon_unknown_0::ConvertToAnimatable<int>
                      ((optional<tinyusdz::Animatable<int>_> *)local_488,
                       (PrimVar *)&p_Var12[4]._M_parent);
            uVar3 = local_488[0];
            local_2b0[0] = local_488[0];
            if (local_488[0] == '\x01') {
              sStack_2a4._0_2_ = sStack_47c._0_2_;
              local_2b0._8_4_ = local_488._8_4_;
              local_2a0._M_allocated_capacity = local_478._0_8_;
              local_2a0._8_8_ = local_478._8_8_;
              sStack_290.data.__align = local_468.data.__align;
              local_478[0] = false;
              local_478._1_3_ = 0;
              local_478._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
              local_478._8_8_ = 0;
              local_468.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              sStack_290._8_1_ = local_468._8_1_;
              nonstd::optional_lite::optional<tinyusdz::Animatable<int>>::operator=
                        ((optional<tinyusdz::Animatable<int>> *)local_4f0._40_8_,
                         (Animatable<int> *)(local_2b0 + 8));
            }
            else {
              local_5e0._0_4_ = 8;
              warn = (string *)0x55;
              ::std::__cxx11::string::_M_replace
                        ((ulong)local_5d8,0,(char *)local_5d8._8_8_,0x42e0dc);
            }
            if (((bool)local_2b0[0] == true) &&
               ((optional<tinyusdz::Interpolation>)local_2a0._M_allocated_capacity !=
                (optional<tinyusdz::Interpolation>)0x0)) {
              operator_delete((void *)local_2a0._M_allocated_capacity,
                              (long)sStack_290.data._0_8_ - local_2a0._0_8_);
            }
            if (uVar3 != '\0') {
              AttrMetas::operator=((AttrMetas *)local_588,(AttrMetas *)(p_Var12 + 7));
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_540,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5b8);
              local_5e0 = (undefined1  [8])((ulong)local_5e0 & 0xffffffff00000000);
            }
            bVar17 = true;
            bVar16 = false;
          }
          if (bVar16) {
            if (p_Var12[6]._M_left != p_Var12[6]._M_parent) {
              AttrMetas::operator=((AttrMetas *)local_588,(AttrMetas *)(p_Var12 + 7));
              __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_510;
              goto LAB_002481ca;
            }
            goto LAB_002481d7;
          }
          if (in_stack_fffffffffffff9f8 != (optional<tinyusdz::Interpolation>)&local_5f8) {
            operator_delete((void *)in_stack_fffffffffffff9f8,local_5f8._M_allocated_capacity + 1);
          }
          if ((bVar17) ||
             (uVar14 = aStack_5c8._M_allocated_capacity,
             oVar13 = (optional<tinyusdz::Interpolation>)local_5d8._0_8_,
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_5d8._0_8_ == &aStack_5c8)) goto LAB_002481f2;
        }
        else {
          local_5e0._0_4_ = 3;
          ::std::__cxx11::stringstream::stringstream((stringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0._M_local_buf,"Property type mismatch. ",0x18);
          poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_2a0._M_local_buf,(char *)local_5b8._0_8_,
                              local_5b8._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," expects type `",0xf);
          local_488._0_8_ = local_478;
          stack0xfffffffffffffb80 = (optional<tinyusdz::Interpolation>)0x3;
          local_478._0_4_ = 0x746e69;
          poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_478,3);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"` but defined as type `",0x17);
          poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(char *)in_stack_fffffffffffff9f8,(long)local_600);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"`",1);
          if ((optional<tinyusdz::Interpolation> *)local_488._0_8_ !=
              (optional<tinyusdz::Interpolation> *)local_478) {
            operator_delete((void *)local_488._0_8_,local_478._0_8_ + 1);
          }
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::operator=((string *)local_5d8,(string *)local_488);
          if ((optional<tinyusdz::Interpolation> *)local_488._0_8_ !=
              (optional<tinyusdz::Interpolation> *)local_478) {
            operator_delete((void *)local_488._0_8_,local_478._0_8_ + 1);
          }
          ::std::__cxx11::stringstream::~stringstream((stringstream *)local_2b0);
          ::std::ios_base::~ios_base((ios_base *)(auStack_240 + 0x10));
LAB_002481d7:
          uVar14 = local_5f8._M_allocated_capacity;
          oVar13 = in_stack_fffffffffffff9f8;
          if (in_stack_fffffffffffff9f8 == (optional<tinyusdz::Interpolation>)&local_5f8)
          goto LAB_002481f2;
        }
        operator_delete((void *)oVar13,uVar14 + 1);
      }
LAB_002481f2:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._0_8_ != local_5a8) {
        operator_delete((void *)local_5b8._0_8_,
                        CONCAT44(local_5a8[0]._M_allocated_capacity._4_4_,
                                 CONCAT13(local_5a8[0]._M_local_buf[3],
                                          CONCAT12(local_5a8[0]._M_local_buf[2],
                                                   (undefined2)local_5a8[0]._M_allocated_capacity)))
                        + 1);
      }
      if (local_510._0_8_ != (long)local_510 + 0x10) {
        operator_delete((void *)local_510._0_8_,local_510._16_8_ + 1);
      }
      iVar4 = 0;
      if (((ulong)local_5e0 & 0xfffffffd) == 0) {
        iVar4 = 3;
LAB_00248471:
        bVar16 = false;
      }
      else {
        bVar16 = true;
        if (local_5e0._0_4_ != 1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
          poVar6 = (ostream *)
                   ::std::ostream::operator<<
                             ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0,
                              0x101c);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          in_stack_fffffffffffff9f8 = (optional<tinyusdz::Interpolation>)&local_5f8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffff9f8,"Parsing attribute `{}` failed. Error: {}",
                     "");
          fmt::format<char[16],std::__cxx11::string>
                    ((string *)local_488,(fmt *)&stack0xfffffffffffff9f8,(string *)"inputs:fallback"
                     ,(char (*) [16])local_5d8,warn);
          poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_2b0,(char *)local_488._0_8_,stack0xfffffffffffffb80);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          if ((optional<tinyusdz::Interpolation> *)local_488._0_8_ !=
              (optional<tinyusdz::Interpolation> *)local_478) {
            operator_delete((void *)local_488._0_8_,local_478._0_8_ + 1);
          }
          if (in_stack_fffffffffffff9f8 != (optional<tinyusdz::Interpolation>)&local_5f8) {
            operator_delete((void *)in_stack_fffffffffffff9f8,local_5f8._M_allocated_capacity + 1);
          }
          if ((anon_struct_8_0_00000001_for___align)local_5e8 !=
              (anon_struct_8_0_00000001_for___align)0x0) {
            ::std::__cxx11::stringbuf::str();
            puVar7 = (undefined8 *)
                     ::std::__cxx11::string::_M_append(&stack0xfffffffffffff9f8,*(ulong *)local_5e8)
            ;
            poVar8 = (optional<tinyusdz::Interpolation> *)(puVar7 + 2);
            if ((optional<tinyusdz::Interpolation> *)*puVar7 == poVar8) {
              local_478._0_8_ = *poVar8;
              local_478._8_8_ = puVar7[3];
              local_488._0_8_ = (optional<tinyusdz::Interpolation> *)local_478;
            }
            else {
              local_478._0_8_ = *poVar8;
              local_488._0_8_ = (optional<tinyusdz::Interpolation> *)*puVar7;
            }
            unique0x00012000 = *(optional<tinyusdz::Interpolation> *)(puVar7 + 1);
            *puVar7 = poVar8;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)local_5e8,(string *)local_488);
            if ((optional<tinyusdz::Interpolation> *)local_488._0_8_ !=
                (optional<tinyusdz::Interpolation> *)local_478) {
              operator_delete((void *)local_488._0_8_,local_478._0_8_ + 1);
            }
            if (in_stack_fffffffffffff9f8 != (optional<tinyusdz::Interpolation>)&local_5f8) {
              operator_delete((void *)in_stack_fffffffffffff9f8,local_5f8._M_allocated_capacity + 1)
              ;
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
          ::std::ios_base::~ios_base((ios_base *)auStack_240);
          iVar4 = 1;
          goto LAB_00248471;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d8._0_8_ != &aStack_5c8) {
        operator_delete((void *)local_5d8._0_8_,aStack_5c8._M_allocated_capacity + 1);
      }
      if (bVar16) {
        local_548 = (undefined1  [8])(p_Var12 + 1);
        iVar4 = ::std::__cxx11::string::compare((char *)local_548);
        if (iVar4 == 0) {
          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2f0,"inputs:varname","");
          cVar9 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_540,&local_2f0);
          bVar16 = cVar9._M_node == (_Base_ptr)(local_540 + 8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar16 = false;
        }
        if (bVar16) {
          local_2b0._0_8_ = ((ulong)local_2b0._0_8_ >> 8 & 0xffffff) << 8;
          stack0xfffffffffffffd58 =
               (optional<unsigned_int>)(((ulong)stack0xfffffffffffffd58 >> 8 & 0xffffff) << 8);
          local_2a0._M_allocated_capacity = local_2a0._M_allocated_capacity & 0xffffffffffff0000;
          local_2a0._8_8_ = local_2a0._8_8_ & 0xffffffffffffff00;
          auStack_240._32_8_ = 0;
          auStack_240[0x28] = 0;
          local_110._16_8_ = 0;
          local_110._24_8_ = 0;
          local_110.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_110._8_8_ = 0;
          local_e8._0_4_ = 0;
          local_e8._8_8_ = 0;
          local_260 = false;
          sStack_290._32_8_ = (pointer)0x0;
          sStack_290._40_8_ = 0;
          sStack_290._16_8_ = (pointer)0x0;
          sStack_290._24_8_ = (pointer)0x0;
          sStack_290.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          sStack_290._8_8_ = 0;
          auStack_240[0x18] = 0;
          auStack_240._8_8_ = 0;
          auStack_240._16_8_ = 0;
          local_258._16_8_ = 0;
          auStack_240._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_258[0] = false;
          local_258._1_3_ = 0;
          local_258._4_4_ = (storage_t<unsigned_int>)0x0;
          local_258._8_8_ = 0;
          local_210[0x20] = 0;
          local_210._16_8_ = 0;
          local_210._24_8_ = 0;
          local_210._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_210._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_1c8 = false;
          local_1e8._16_8_ = 0;
          local_1e8._24_8_ = (storage_t<double>)0x0;
          local_1e8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_1e8._8_8_ = 0;
          local_1a0 = false;
          local_1c0._16_8_ = 0;
          local_1c0._24_8_ = 0;
          local_1c0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_1c0._8_8_ = 0;
          local_198[0x30] = 0;
          local_198._32_8_ = 0;
          local_198._40_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_198._16_8_ = 0;
          local_198._24_8_ = 0;
          local_198._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_198._8_8_ = 0;
          local_160[0x20] = 0;
          local_160._16_8_ = 0;
          local_160._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_160._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_160._8_8_ = 0;
          local_118 = false;
          local_138._16_8_ = 0;
          local_138._24_8_ = 0;
          local_138.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_138._8_8_ = 0;
          local_e8._16_8_ = &local_e8;
          sStack_c0._24_1_ = 0;
          sStack_c0._8_8_ = 0;
          sStack_c0._16_8_ = 0;
          local_c8 = 0;
          sStack_c0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_a0[0x10] = 0;
          stack0xffffffffffffff71 = 0;
          local_a0._0_8_ = (pointer)0x0;
          local_a0[8] = _S_red;
          local_a0._9_7_ = 0;
          local_80[0x40] = '\0';
          local_80._65_8_ = 0;
          local_80._48_8_ = (pointer)0x0;
          local_80[0x38] = 0;
          local_80._57_7_ = 0;
          local_80._32_8_ = (pointer)0x0;
          local_80._40_8_ = 0;
          local_80._16_8_ = (pointer)0x0;
          local_80._24_8_ = (pointer)0x0;
          local_80._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_80._8_8_ = 0;
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          local_e8._24_8_ = local_e8._16_8_;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2d0,*(long *)(p_Var12 + 1),
                     (long)&(p_Var12[1]._M_parent)->_M_color + *(long *)(p_Var12 + 1));
          warn = (string *)local_488;
          local_488._0_8_ = (optional<tinyusdz::Interpolation> *)local_478;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)warn,"inputs:varname","");
          err = (string *)local_2b0;
          anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                    ((ParseResult *)local_5e0,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_540,&local_2d0,(Property *)local_5a8[1]._0_8_,warn,
                     (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0);
          if ((optional<tinyusdz::Interpolation> *)local_488._0_8_ !=
              (optional<tinyusdz::Interpolation> *)local_478) {
            operator_delete((void *)local_488._0_8_,local_478._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
          if (local_5e0._0_4_ == 3) {
            local_310._0_8_ = (long)local_310 + 0x10;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_310,*(long *)(p_Var12 + 1),
                       (long)&(p_Var12[1]._M_parent)->_M_color + *(long *)(p_Var12 + 1));
            in_stack_fffffffffffff9f8 = (optional<tinyusdz::Interpolation>)&local_5f8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&stack0xfffffffffffff9f8,"inputs:varname","");
            uVar14 = local_5a8[1]._0_8_;
            warn = (string *)&stack0xfffffffffffff9f8;
            err = (string *)local_580._48_8_;
            (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                      ((ParseResult *)local_488,(_anonymous_namespace_ *)local_540,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_310,(string *)local_5a8[1]._0_8_,
                       (Property *)&stack0xfffffffffffff9f8,(string *)local_580._48_8_,
                       (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff9f8);
            local_5e0._0_4_ = local_488._0_4_;
            ::std::__cxx11::string::operator=((string *)local_5d8,(string *)(local_488 + 8));
            if (stack0xfffffffffffffb80 != (long)local_478 + 8) {
              operator_delete((void *)stack0xfffffffffffffb80,local_478._8_8_ + 1);
            }
            if (in_stack_fffffffffffff9f8 != (optional<tinyusdz::Interpolation>)&local_5f8) {
              operator_delete((void *)in_stack_fffffffffffff9f8,local_5f8._M_allocated_capacity + 1)
              ;
            }
            if (local_310._0_8_ != (long)local_310 + 0x10) {
              operator_delete((void *)local_310._0_8_,local_310._16_8_ + 1);
            }
            if (local_5e0._0_4_ != 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_488,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_488,"ReconstructShader",0x11);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"():",3);
              poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_488,0x102c);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              local_5b8._0_8_ = local_5a8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_5b8,"Faied to parse inputs:varname: {}","");
              fmt::format<std::__cxx11::string>
                        ((string *)&stack0xfffffffffffff9f8,(fmt *)local_5b8,(string *)local_5d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar14
                        );
              poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_488,(char *)in_stack_fffffffffffff9f8,
                                  (long)local_600);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
              if (in_stack_fffffffffffff9f8 != (optional<tinyusdz::Interpolation>)&local_5f8) {
                operator_delete((void *)in_stack_fffffffffffff9f8,
                                local_5f8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5b8._0_8_ != local_5a8) {
                operator_delete((void *)local_5b8._0_8_,
                                CONCAT44(local_5a8[0]._M_allocated_capacity._4_4_,
                                         CONCAT13(local_5a8[0]._M_local_buf[3],
                                                  CONCAT12(local_5a8[0]._M_local_buf[2],
                                                           (undefined2)
                                                           local_5a8[0]._M_allocated_capacity))) + 1
                               );
              }
              goto LAB_00248a7e;
            }
LAB_00248adf:
            iVar4 = 3;
LAB_00248bad:
            bVar16 = false;
          }
          else {
            if (local_5e0._0_4_ == 0) {
              bVar16 = ConvertTokenAttributeToStringAttribute
                                 ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)
                                  local_2b0,
                                  (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_580._48_8_);
              if (bVar16) goto LAB_00248adf;
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_488,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_488,"ReconstructShader",0x11);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"():",3);
              poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_488,0x1023);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_488,
                         "Failed to convert inputs:varname token type to string type.",0x3b);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"\n",1);
LAB_00248a7e:
              if ((anon_struct_8_0_00000001_for___align)local_5e8 !=
                  (anon_struct_8_0_00000001_for___align)0x0) {
                ::std::__cxx11::stringbuf::str();
                poVar8 = (optional<tinyusdz::Interpolation> *)
                         ::std::__cxx11::string::_M_append(local_5b8,*(ulong *)local_5e8);
                oVar13 = (optional<tinyusdz::Interpolation>)(poVar8 + 2);
                if (*poVar8 == oVar13) {
                  local_5f8._M_allocated_capacity = *(undefined8 *)oVar13;
                  local_5f8._8_8_ = poVar8[3];
                  in_stack_fffffffffffff9f8 = (optional<tinyusdz::Interpolation>)&local_5f8;
                }
                else {
                  local_5f8._M_allocated_capacity = *(undefined8 *)oVar13;
                  in_stack_fffffffffffff9f8 = *poVar8;
                }
                local_600 = poVar8[1];
                *poVar8 = oVar13;
                poVar8[1].has_value_ = false;
                *(undefined3 *)&poVar8[1].field_0x1 = 0;
                poVar8[1].contained = (storage_t<tinyusdz::Interpolation>)0x0;
                poVar8[2].has_value_ = false;
                ::std::__cxx11::string::operator=
                          ((string *)local_5e8,(string *)&stack0xfffffffffffff9f8);
                if (in_stack_fffffffffffff9f8 != (optional<tinyusdz::Interpolation>)&local_5f8) {
                  operator_delete((void *)in_stack_fffffffffffff9f8,
                                  local_5f8._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5b8._0_8_ != local_5a8) {
                  operator_delete((void *)local_5b8._0_8_,
                                  CONCAT44(local_5a8[0]._M_allocated_capacity._4_4_,
                                           CONCAT13(local_5a8[0]._M_local_buf[3],
                                                    CONCAT12(local_5a8[0]._M_local_buf[2],
                                                             (undefined2)
                                                             local_5a8[0]._M_allocated_capacity))) +
                                  1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
              ::std::ios_base::~ios_base(local_418);
              iVar4 = 1;
              goto LAB_00248bad;
            }
            iVar4 = 0;
            bVar16 = true;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5d8._0_8_ != &aStack_5c8) {
            operator_delete((void *)local_5d8._0_8_,aStack_5c8._M_allocated_capacity + 1);
          }
          if (bStack_88 == true) {
            nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::Token>_>::
            destruct_value((storage_t<tinyusdz::Animatable<tinyusdz::Token>_> *)local_80);
          }
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_a0);
          AttrMetas::~AttrMetas((AttrMetas *)local_2b0);
          if (!bVar16) goto LAB_00249422;
        }
        local_4b8._16_8_ = local_4a0 + 8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_4b8 + 0x10),*(long *)(p_Var12 + 1),
                   (long)&(p_Var12[1]._M_parent)->_M_color + *(long *)(p_Var12 + 1));
        local_580._0_8_ = local_580 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"outputs:result","");
        uVar2 = local_4a0._0_8_;
        uVar14 = local_580._8_8_;
        unique0x00005300 = (long)local_478 + 8;
        local_478[0] = false;
        local_478._1_3_ = 0;
        local_478._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
        local_478._8_8_ = local_478._8_8_ & 0xffffffffffffff00;
        __n = (storage_t<double>)local_4a0._0_8_;
        if ((ulong)local_580._8_8_ < (ulong)local_4a0._0_8_) {
          __n = (storage_t<double>)local_580._8_8_;
        }
        if (__n == (storage_t<double>)0x0) {
          bVar16 = true;
        }
        else {
          iVar4 = bcmp((void *)local_4b8._16_8_,(void *)local_580._0_8_,(size_t)__n);
          bVar16 = iVar4 == 0;
        }
        if ((bool)(bVar16 ^ 1U | uVar2 != uVar14)) {
          local_488._0_4_ = 1;
        }
        else {
          cVar9 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_540,(key_type *)local_580);
          if (cVar9._M_node == (_Base_ptr)(local_540 + 8)) {
            if ((*(uint *)((long)&p_Var12[0x17]._M_parent + 4) < 2) &&
               (bVar16 = Attribute::is_connection((Attribute *)local_5a8[1]._0_8_), bVar16)) {
              local_488._0_4_ = 5;
              warn = (string *)0x38;
              ::std::__cxx11::string::_M_replace
                        ((ulong)(local_488 + 8),0,(char *)local_478._0_8_,0x4300a5);
            }
            else if (*(int *)((long)&p_Var12[0x17]._M_parent + 4) == 0) {
              Attribute::type_name_abi_cxx11_((string *)local_2b0,(Attribute *)local_5a8[1]._0_8_);
              bVar16 = tinyusdz::value::IsRoleType((string *)local_2b0);
              local_5e0 = (undefined1  [8])(local_5d8 + 8);
              local_5d8[0] = true;
              local_5d8._1_3_ = 0;
              local_5d8._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
              local_5d8._8_4_ = 0x746e69;
              if ((stack0xfffffffffffffd58 == (optional<unsigned_int>)0x3) &&
                 (*(char *)(local_2b0._0_8_ + 2) == 't' && *(short *)local_2b0._0_8_ == 0x6e69)) {
                *(bool *)(local_5a8[1]._8_8_ + 0xe18) = true;
LAB_00249483:
                AttrMetas::operator=((AttrMetas *)local_580._32_8_,(AttrMetas *)(p_Var12 + 7));
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)local_540,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_580);
                local_488._0_8_ = local_488._0_8_ & 0xffffffff00000000;
              }
              else {
                if (bVar16) {
                  uVar5 = tinyusdz::value::GetUnderlyingTypeId((string *)local_2b0);
                  if (uVar5 == 0xf) {
                    *(bool *)(local_5a8[1]._8_8_ + 0xe18) = true;
                    ::std::__cxx11::string::_M_assign((string *)local_4f0._32_8_);
                    goto LAB_00249483;
                  }
                  local_488._0_4_ = 3;
                  local_5b8[0] = true;
                  local_5b8._1_3_ = 0;
                  local_5b8._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
                  oVar13 = (optional<tinyusdz::Interpolation>)
                           ::std::__cxx11::string::_M_create
                                     ((ulong *)&stack0xfffffffffffff9f8,(ulong)local_5b8);
                  __n_00 = 0x61;
                  __src = 
                  "Attribute type mismatch. {} expects type `{}` but defined as type `{}`(and its underlying types)."
                  ;
                }
                else {
                  local_488._0_4_ = 3;
                  local_5b8[0] = true;
                  local_5b8._1_3_ = 0;
                  local_5b8._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
                  oVar13 = (optional<tinyusdz::Interpolation>)
                           ::std::__cxx11::string::_M_create
                                     ((ulong *)&stack0xfffffffffffff9f8,(ulong)local_5b8);
                  __n_00 = 0x46;
                  __src = "Property type mismatch. {} expects type `{}` but defined as type `{}`.";
                }
                uVar14 = local_5b8._0_8_;
                in_stack_fffffffffffff9f8 = oVar13;
                local_5f8._M_allocated_capacity = local_5b8._0_8_;
                memcpy((void *)oVar13,__src,__n_00);
                local_5b8[0] = (undefined1)uVar14;
                local_5b8._1_3_ = SUB83(uVar14,1);
                local_5b8._4_4_ = SUB84(uVar14,4);
                local_600.has_value_ = (bool)local_5b8[0];
                local_600._1_3_ = local_5b8._1_3_;
                local_600.contained = (storage_t<tinyusdz::Interpolation>)local_5b8._4_4_;
                *(char *)((long)oVar13 + uVar14) = '\0';
                local_5b8._0_8_ = local_5a8;
                local_5a8[0]._M_local_buf[2] = 't';
                local_5a8[0]._M_allocated_capacity._0_2_ = 0x6e69;
                local_5b8._8_8_ = (anon_struct_8_0_00000001_for___align)0x3;
                local_5a8[0]._M_local_buf[3] = '\0';
                warn = (string *)local_2b0;
                fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                          ((string *)local_5e0,(fmt *)&stack0xfffffffffffff9f8,(string *)local_580,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_5b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2b0,err);
                ::std::__cxx11::string::operator=((string *)(local_488 + 8),(string *)local_5e0);
                if (local_5e0 != (undefined1  [8])(local_5d8 + 8)) {
                  operator_delete((void *)local_5e0,(ulong)(local_5d8._8_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5b8._0_8_ != local_5a8) {
                  operator_delete((void *)local_5b8._0_8_,
                                  CONCAT44(local_5a8[0]._M_allocated_capacity._4_4_,
                                           CONCAT13(local_5a8[0]._M_local_buf[3],
                                                    CONCAT12(local_5a8[0]._M_local_buf[2],
                                                             (undefined2)
                                                             local_5a8[0]._M_allocated_capacity))) +
                                  1);
                }
                if (in_stack_fffffffffffff9f8 != (optional<tinyusdz::Interpolation>)&local_5f8) {
                  operator_delete((void *)in_stack_fffffffffffff9f8,
                                  local_5f8._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._0_8_ != &local_2a0) {
                operator_delete((void *)local_2b0._0_8_,local_2a0._M_allocated_capacity + 1);
              }
            }
            else {
              warn = (string *)&DAT_00000041;
              ::std::__cxx11::string::_M_replace
                        ((ulong)(local_488 + 8),0,(char *)local_478._0_8_,0x4300de);
              local_488._0_4_ = 6;
            }
          }
          else {
            local_488._0_4_ = 2;
          }
        }
        if ((pointer)local_580._0_8_ != (pointer)(local_580 + 0x10)) {
          operator_delete((void *)local_580._0_8_,(ulong)(local_580._16_8_ + 1));
        }
        if ((undefined1 *)local_4b8._16_8_ != local_4a0 + 8) {
          operator_delete((void *)local_4b8._16_8_,local_4a0._8_8_ + 1);
        }
        iVar4 = 0;
        if ((local_488._0_8_ & 0xfffffffd) == 0) {
          iVar4 = 3;
LAB_00249005:
          bVar16 = false;
        }
        else {
          bVar16 = true;
          if (local_488._0_4_ != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar6 = (ostream *)
                     ::std::ostream::operator<<
                               ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0,
                                0x1031);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            in_stack_fffffffffffff9f8 = (optional<tinyusdz::Interpolation>)&local_5f8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&stack0xfffffffffffff9f8,
                       "Parsing shader output property `{}` failed. Error: {}","");
            fmt::format<char[15],std::__cxx11::string>
                      ((string *)local_5e0,(fmt *)&stack0xfffffffffffff9f8,
                       (string *)"outputs:result",(char (*) [15])(local_488 + 8),warn);
            poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_2b0,(char *)local_5e0,local_5d8._0_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
            if (local_5e0 != (undefined1  [8])(local_5d8 + 8)) {
              operator_delete((void *)local_5e0,(ulong)(local_5d8._8_8_ + 1));
            }
            if (in_stack_fffffffffffff9f8 != (optional<tinyusdz::Interpolation>)&local_5f8) {
              operator_delete((void *)in_stack_fffffffffffff9f8,local_5f8._M_allocated_capacity + 1)
              ;
            }
            if ((anon_struct_8_0_00000001_for___align)local_5e8 !=
                (anon_struct_8_0_00000001_for___align)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar10 = (long *)::std::__cxx11::string::_M_append
                                          (&stack0xfffffffffffff9f8,*(ulong *)local_5e8);
              plVar1 = plVar10 + 2;
              if ((long *)*plVar10 == plVar1) {
                local_5d8._8_8_ = *plVar1;
                aStack_5c8._M_allocated_capacity = plVar10[3];
                local_5e0 = (undefined1  [8])(local_5d8 + 8);
              }
              else {
                local_5d8._8_8_ = *plVar1;
                local_5e0 = (undefined1  [8])*plVar10;
              }
              local_5d8._0_8_ = *(optional<tinyusdz::Interpolation> *)(plVar10 + 1);
              *plVar10 = (long)plVar1;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)local_5e8,(string *)local_5e0);
              if (local_5e0 != (undefined1  [8])(local_5d8 + 8)) {
                operator_delete((void *)local_5e0,(ulong)(local_5d8._8_8_ + 1));
              }
              if (in_stack_fffffffffffff9f8 != (optional<tinyusdz::Interpolation>)&local_5f8) {
                operator_delete((void *)in_stack_fffffffffffff9f8,
                                local_5f8._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base((ios_base *)auStack_240);
            iVar4 = 1;
            goto LAB_00249005;
          }
        }
        if (stack0xfffffffffffffb80 != (long)local_478 + 8) {
          operator_delete((void *)stack0xfffffffffffffb80,local_478._8_8_ + 1);
        }
        aVar15 = (anon_struct_8_0_00000001_for___align)local_548;
        if (bVar16) {
          cVar9 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_540,(key_type *)local_548);
          if (cVar9._M_node == (_Base_ptr)(local_540 + 8)) {
            pmVar11 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                    *)local_4f0._48_8_,(key_type *)aVar15);
            ::std::__cxx11::string::_M_assign((string *)pmVar11);
            (pmVar11->_attrib)._varying_authored = (bool)p_Var12[3].field_0x4;
            (pmVar11->_attrib)._variability = p_Var12[3]._M_color;
            ::std::__cxx11::string::_M_assign((string *)&(pmVar11->_attrib)._type_name);
            linb::any::operator=((any *)&(pmVar11->_attrib)._var,(any *)&p_Var12[4]._M_parent);
            (pmVar11->_attrib)._var._blocked = SUB41(p_Var12[5]._M_color,0);
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::operator=(&(pmVar11->_attrib)._var._ts._samples,
                        (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)&p_Var12[5]._M_parent);
            (pmVar11->_attrib)._var._ts._dirty = SUB41(p_Var12[6]._M_color,0);
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      (&(pmVar11->_attrib)._paths,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var12[6]._M_parent);
            AttrMetas::operator=(&(pmVar11->_attrib)._metas,(AttrMetas *)(p_Var12 + 7));
            *(_Base_ptr *)&pmVar11->_listOpQual = p_Var12[0x17]._M_parent;
            (pmVar11->_rel).type = *(Type *)&p_Var12[0x17]._M_left;
            Path::operator=(&(pmVar11->_rel).targetPath,(Path *)&p_Var12[0x17]._M_right);
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      (&(pmVar11->_rel).targetPathVector,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var12[0x1e]._M_parent);
            (pmVar11->_rel).listOpQual = p_Var12[0x1f]._M_color;
            AttrMetas::operator=(&(pmVar11->_rel)._metas,(AttrMetas *)&p_Var12[0x1f]._M_parent);
            (pmVar11->_rel)._varying_authored = *(bool *)&p_Var12[0x2f]._M_left;
            ::std::__cxx11::string::_M_assign((string *)&pmVar11->_prop_value_type_name);
            aVar15 = (anon_struct_8_0_00000001_for___align)local_548;
            pmVar11->_has_custom = *(bool *)&p_Var12[0x30]._M_right;
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)local_540,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_548);
          }
          cVar9 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_540,(key_type *)aVar15);
          iVar4 = 0;
          if (cVar9._M_node == (_Base_ptr)(local_540 + 8)) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[warn]",6);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar6 = (ostream *)
                     ::std::ostream::operator<<
                               ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0,
                                0x1033);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_488,"Unsupported/unimplemented property: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             aVar15);
            poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_2b0,(char *)local_488._0_8_,stack0xfffffffffffffb80
                               );
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
            if ((optional<tinyusdz::Interpolation> *)local_488._0_8_ !=
                (optional<tinyusdz::Interpolation> *)local_478) {
              operator_delete((void *)local_488._0_8_,local_478._0_8_ + 1);
            }
            if ((string *)local_580._40_8_ != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              puVar7 = (undefined8 *)
                       ::std::__cxx11::string::_M_append(local_5e0,*(ulong *)local_5e8);
              poVar8 = (optional<tinyusdz::Interpolation> *)(puVar7 + 2);
              if ((optional<tinyusdz::Interpolation> *)*puVar7 == poVar8) {
                local_478._0_8_ = *poVar8;
                local_478._8_8_ = puVar7[3];
                local_488._0_8_ = (optional<tinyusdz::Interpolation> *)local_478;
              }
              else {
                local_478._0_8_ = *poVar8;
                local_488._0_8_ = (optional<tinyusdz::Interpolation> *)*puVar7;
              }
              unique0x00012000 = *(optional<tinyusdz::Interpolation> *)(puVar7 + 1);
              *puVar7 = poVar8;
              puVar7[1] = 0;
              *(undefined1 *)(puVar7 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)local_580._40_8_,(string *)local_488);
              if ((optional<tinyusdz::Interpolation> *)local_488._0_8_ !=
                  (optional<tinyusdz::Interpolation> *)local_478) {
                operator_delete((void *)local_488._0_8_,local_478._0_8_ + 1);
              }
              if (local_5e0 != (undefined1  [8])(local_5d8 + 8)) {
                operator_delete((void *)local_5e0,(ulong)(local_5d8._8_8_ + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base((ios_base *)auStack_240);
          }
        }
      }
LAB_00249422:
    } while (((iVar4 == 3) || (iVar4 == 0)) &&
            (p_Var12 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var12),
            p_Var12 != (_Base_ptr)local_4b8._8_8_));
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_540,(_Link_type)local_540._16_8_);
  return false;
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_int>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_int *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>
  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_int,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        ret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
        if (ret.code == ParseResult::ResultCode::Success) {
          // ok
          continue;
        } else {
          PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", ret.err));
        }
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_int, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_int, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return false;
}